

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86.cpp
# Opt level: O1

int __thiscall ncnn::Cast_x86::forward(Cast_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int _d;
  int iVar4;
  int _elempack;
  int *piVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  undefined1 auVar9 [12];
  unsigned_short uVar10;
  int iVar11;
  void *pvVar12;
  uint uVar13;
  void *pvVar14;
  long lVar15;
  long lVar16;
  undefined1 (*pauVar17) [16];
  undefined8 *puVar18;
  ulong uVar19;
  undefined4 *puVar20;
  int iVar21;
  ulong uVar22;
  size_t sVar23;
  uint uVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  iVar21 = (this->super_Cast).type_from;
  iVar11 = (this->super_Cast).type_to;
  if (iVar21 == iVar11) {
    iVar21 = 0;
    if (top_blob != bottom_blob) {
      piVar5 = bottom_blob->refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      piVar5 = top_blob->refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar5 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar5;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar11 = bottom_blob->w;
      iVar2 = bottom_blob->h;
      iVar3 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar11;
      top_blob->h = iVar2;
      top_blob->d = iVar3;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
    }
  }
  else {
    iVar2 = bottom_blob->w;
    iVar3 = bottom_blob->h;
    _d = bottom_blob->d;
    uVar13 = bottom_blob->c;
    iVar4 = bottom_blob->dims;
    _elempack = bottom_blob->elempack;
    sVar23 = (size_t)_elempack;
    switch(iVar11) {
    case 1:
      if (iVar21 == 3) {
        Cast::forward(&this->super_Cast,bottom_blob,top_blob,opt);
      }
      sVar23 = sVar23 * 4;
      break;
    case 2:
    case 4:
      sVar23 = (size_t)(_elempack * 2);
      break;
    case 3:
      break;
    default:
      sVar23 = bottom_blob->elemsize;
    }
    switch(iVar4) {
    case 1:
      Mat::create(top_blob,iVar2,sVar23,_elempack,opt->blob_allocator);
      break;
    case 2:
      Mat::create(top_blob,iVar2,iVar3,sVar23,_elempack,opt->blob_allocator);
      break;
    case 3:
      Mat::create(top_blob,iVar2,iVar3,uVar13,sVar23,_elempack,opt->blob_allocator);
      break;
    case 4:
      Mat::create(top_blob,iVar2,iVar3,_d,uVar13,sVar23,_elempack,opt->blob_allocator);
    }
    iVar21 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      if (((this->super_Cast).type_from == 1) &&
         (((this->super_Cast).type_to == 2 && (iVar21 = bottom_blob->c, 0 < (long)iVar21)))) {
        iVar11 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar16 = 0;
        do {
          if (0 < iVar11) {
            sVar23 = top_blob->cstep;
            sVar6 = bottom_blob->cstep;
            sVar7 = top_blob->elemsize;
            pvVar12 = top_blob->data;
            sVar8 = bottom_blob->elemsize;
            pvVar14 = bottom_blob->data;
            lVar15 = 0;
            do {
              uVar10 = float32_to_float16(*(float *)((long)pvVar14 +
                                                    lVar15 * 4 + sVar6 * sVar8 * lVar16));
              *(unsigned_short *)((long)pvVar12 + lVar15 * 2 + sVar23 * sVar7 * lVar16) = uVar10;
              lVar15 = lVar15 + 1;
            } while (iVar11 != (int)lVar15);
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != iVar21);
      }
      if ((((this->super_Cast).type_from == 2) && ((this->super_Cast).type_to == 1)) &&
         (iVar21 = bottom_blob->c, 0 < (long)iVar21)) {
        iVar11 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar16 = 0;
        do {
          if (0 < iVar11) {
            sVar23 = top_blob->cstep;
            sVar6 = bottom_blob->cstep;
            sVar7 = top_blob->elemsize;
            pvVar12 = top_blob->data;
            sVar8 = bottom_blob->elemsize;
            pvVar14 = bottom_blob->data;
            lVar15 = 0;
            do {
              fVar25 = float16_to_float32(*(unsigned_short *)
                                           ((long)pvVar14 + lVar15 * 2 + sVar6 * sVar8 * lVar16));
              *(float *)((long)pvVar12 + lVar15 * 4 + sVar23 * sVar7 * lVar16) = fVar25;
              lVar15 = lVar15 + 1;
            } while (iVar11 != (int)lVar15);
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != iVar21);
      }
      if (0 < (int)uVar13 && ((this->super_Cast).type_to == 1 && (this->super_Cast).type_from == 3))
      {
        uVar24 = _d * _elempack * iVar3 * iVar2;
        pvVar12 = bottom_blob->data;
        sVar23 = bottom_blob->cstep;
        pvVar14 = top_blob->data;
        sVar6 = top_blob->cstep;
        sVar7 = top_blob->elemsize;
        sVar8 = bottom_blob->elemsize;
        uVar19 = 0;
        do {
          if (0 < (int)uVar24) {
            uVar22 = 0;
            do {
              *(float *)((long)pvVar14 + uVar22 * 4) = (float)(int)*(char *)((long)pvVar12 + uVar22)
              ;
              uVar22 = uVar22 + 1;
            } while (uVar24 != uVar22);
          }
          uVar19 = uVar19 + 1;
          pvVar14 = (void *)((long)pvVar14 + sVar6 * sVar7);
          pvVar12 = (void *)((long)pvVar12 + sVar23 * sVar8);
        } while (uVar19 != uVar13);
      }
      if ((((this->super_Cast).type_from == 1) && ((this->super_Cast).type_to == 4)) &&
         (iVar21 = bottom_blob->c, 0 < (long)iVar21)) {
        uVar13 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar16 = 0;
        do {
          pauVar17 = (undefined1 (*) [16])
                     (bottom_blob->cstep * lVar16 * bottom_blob->elemsize + (long)bottom_blob->data)
          ;
          puVar20 = (undefined4 *)
                    (top_blob->cstep * lVar16 * top_blob->elemsize + (long)top_blob->data);
          if ((int)uVar13 < 8) {
            uVar24 = 0;
          }
          else {
            iVar11 = 7;
            do {
              auVar26 = pshuflw(*pauVar17,*pauVar17,0xed);
              auVar26 = pshufhw(auVar26,auVar26,0xed);
              auVar27 = pshuflw(pauVar17[1],pauVar17[1],0xed);
              auVar27 = pshufhw(auVar27,auVar27,0xed);
              *puVar20 = auVar26._0_4_;
              puVar20[1] = auVar26._8_4_;
              puVar20[2] = auVar27._0_4_;
              puVar20[3] = auVar27._8_4_;
              pauVar17 = pauVar17 + 2;
              puVar20 = puVar20 + 4;
              iVar11 = iVar11 + 8;
              uVar24 = uVar13 & 0xfffffff8;
            } while (iVar11 < (int)uVar13);
          }
          if (uVar13 - uVar24 != 0 && (int)uVar24 <= (int)uVar13) {
            lVar15 = 0;
            do {
              *(undefined2 *)((long)puVar20 + lVar15 * 2) =
                   *(undefined2 *)(*pauVar17 + lVar15 * 4 + 2);
              lVar15 = lVar15 + 1;
            } while (uVar13 - uVar24 != (int)lVar15);
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != iVar21);
      }
      iVar21 = 0;
      if ((((this->super_Cast).type_from == 4) && (iVar21 = 0, (this->super_Cast).type_to == 1)) &&
         (iVar11 = bottom_blob->c, 0 < (long)iVar11)) {
        uVar13 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar16 = 0;
        do {
          puVar18 = (undefined8 *)
                    (bottom_blob->cstep * lVar16 * bottom_blob->elemsize + (long)bottom_blob->data);
          pauVar17 = (undefined1 (*) [16])
                     (top_blob->cstep * lVar16 * top_blob->elemsize + (long)top_blob->data);
          if ((int)uVar13 < 4) {
            uVar24 = 0;
          }
          else {
            iVar21 = 3;
            do {
              uVar1 = *puVar18;
              auVar9._10_2_ = (short)((ulong)uVar1 >> 0x20);
              auVar9._0_10_ = (unkuint10)0;
              auVar26._2_12_ =
                   SUB1612(ZEXT616(CONCAT42(auVar9._8_4_,(short)((ulong)uVar1 >> 0x10))) << 0x30,4);
              auVar26._0_2_ = (short)uVar1;
              auVar26._14_2_ = 0;
              *pauVar17 = auVar26 << 0x10;
              puVar18 = puVar18 + 1;
              pauVar17 = pauVar17 + 1;
              iVar21 = iVar21 + 4;
              uVar24 = uVar13 & 0xfffffffc;
            } while (iVar21 < (int)uVar13);
          }
          if (uVar13 - uVar24 != 0 && (int)uVar24 <= (int)uVar13) {
            lVar15 = 0;
            do {
              *(uint *)((long)*pauVar17 + lVar15 * 4) =
                   (uint)*(ushort *)((long)puVar18 + lVar15 * 2) << 0x10;
              lVar15 = lVar15 + 1;
            } while (uVar13 - uVar24 != (int)lVar15);
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != iVar11);
        iVar21 = 0;
      }
    }
  }
  return iVar21;
}

Assistant:

int Cast_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}